

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

Error __thiscall asmjit::CodeHolder::reserveBuffer(CodeHolder *this,CodeBuffer *cb,size_t n)

{
  Error EVar1;
  
  EVar1 = 0;
  if (cb->_capacity < n) {
    if (cb->_isFixedSize == false) {
      if (this->_cgAsm != (Assembler *)0x0) {
        (*(this->_cgAsm->super_CodeEmitter)._vptr_CodeEmitter[0x10])();
      }
      EVar1 = CodeHolder_reserveInternal(this,cb,n);
      return EVar1;
    }
    EVar1 = 0xb;
  }
  return EVar1;
}

Assistant:

Error CodeHolder::reserveBuffer(CodeBuffer* cb, size_t n) noexcept {
  size_t capacity = cb->getCapacity();
  if (n <= capacity) return kErrorOk;

  if (cb->isFixedSize())
    return DebugUtils::errored(kErrorCodeTooLarge);

  // We must sync, as mentioned in `growBuffer()` as well.
  if (_cgAsm) _cgAsm->sync();

  return CodeHolder_reserveInternal(this, cb, n);
}